

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O3

int add_to_minv(monst *mon,obj *obj)

{
  int iVar1;
  obj *local_28;
  obj *local_20;
  
  local_20 = obj;
  if ((int)obj->where != 0) {
    panic("add_to_minv: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  local_28 = mon->minvent;
  if (local_28 != (obj *)0x0) {
    do {
      iVar1 = merged(&local_28,&local_20);
      if (iVar1 != 0) {
        return 1;
      }
      local_28 = local_28->nobj;
    } while (local_28 != (obj *)0x0);
  }
  local_20->where = '\x04';
  (local_20->v).v_ocarry = mon;
  local_20->nobj = mon->minvent;
  mon->minvent = local_20;
  return 0;
}

Assistant:

int add_to_minv(struct monst *mon, struct obj *obj)
{
    struct obj *otmp;

    if (obj->where != OBJ_FREE) {
	panic("add_to_minv: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    /* merge if possible */
    for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
	if (merged(&otmp, &obj))
	    return 1;	/* obj merged and then free'd */
    /* else insert; don't bother forcing it to end of chain */
    obj->where = OBJ_MINVENT;
    obj->ocarry = mon;
    obj->nobj = mon->minvent;
    mon->minvent = obj;
    return 0;	/* obj on mon's inventory chain */
}